

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall CTcSymFuncBase::~CTcSymFuncBase(CTcSymFuncBase *this)

{
  (this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
  _vptr_CVmHashEntry = (_func_int **)&PTR__CTcSymFuncBase_0034c430;
  CArrayList::~CArrayList(&(this->mod_base_ofs_list_).super_CArrayList);
  CVmHashEntry::~CVmHashEntry((CVmHashEntry *)this);
  return;
}

Assistant:

CTcSymFuncBase(const char *str, size_t len, int copy,
                   int argc, int opt_argc, int varargs, int has_retval,
                   int is_multimethod, int is_multimethod_base,
                   int is_extern, int has_proto)
        : CTcSymbol(str, len, copy, TC_SYM_FUNC)
    {
        /* remember the interface information */
        argc_ = argc;
        opt_argc_ = opt_argc;
        varargs_ = varargs;
        has_retval_ = has_retval;
        is_multimethod_ = is_multimethod;
        is_multimethod_base_ = is_multimethod_base;

        /* note whether it's external */
        is_extern_ = is_extern;

        /* note whether it has a prototype */
        has_proto_ = has_proto;

        /* no code stream anchor yet */
        anchor_ = 0;

        /* no fixups yet */
        fixups_ = 0;

        /* this isn't replacing an external function */
        ext_replace_ = FALSE;

        /* we don't know our code body yet */
        code_body_ = 0;

        /* there's no base modified symbol */
        mod_base_ = 0;

        /* we haven't been modified yet */
        mod_global_ = 0;

        /* assume it's not defined in this file */
        mm_def_ = FALSE;
    }